

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::method(Parser *this,ptr<ObjectExpression> *descriptor,Scope scope)

{
  pointer pcVar1;
  ObjectExpression *this_00;
  ptr<Function> function;
  Identifier identifier;
  IdentifierList parameters;
  undefined1 local_c1;
  Function *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  ptr<Function> local_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  pointer local_50;
  pointer local_48;
  size_type sStack_40;
  unsigned_long local_38;
  unsigned_long uStack_30;
  
  consume(this);
  local_60._0_4_ = (this->currentToken).type;
  pcVar1 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_60._8_8_ = (Klex *)&stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 8),pcVar1,pcVar1 + (this->currentToken).lexeme._M_string_length);
  local_38 = (this->currentToken).line;
  uStack_30 = (this->currentToken).col;
  if ((Klex *)local_60._8_8_ == (Klex *)&stack0xffffffffffffffb8) {
    local_80._24_8_ = sStack_40;
    local_80._0_8_ = (Klex *)(local_80 + 0x10);
  }
  else {
    local_80._0_8_ = local_60._8_8_;
  }
  local_80._16_8_ = local_48;
  local_80._8_8_ = local_50;
  consume(this,Identifier,"identifier");
  consume(this,LeftParen,"\'(\'");
  identifierList_abi_cxx11_((IdentifierList *)local_60,this);
  consume(this,RightParen,"\')\'");
  local_90._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)local_90,
             (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60);
  statementBlock((Parser *)local_a0);
  local_c0 = (Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Function,std::allocator<Function>,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::shared_ptr<StatementBlock>&>
            (&local_b8,&local_c0,(allocator<Function> *)&local_c1,
             (shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_90,(shared_ptr<StatementBlock> *)local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  this_00 = (descriptor->super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b0.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c0;
  local_b0.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b8._M_pi;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
    }
  }
  ObjectExpression::putFunction(this_00,(Identifier *)local_80,scope,&local_b0);
  if (local_b0.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  if ((Klex *)local_80._0_8_ != (Klex *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  return;
}

Assistant:

void Parser::method(ptr<ObjectExpression> &descriptor, Scope scope) {
    consume();

    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::LeftParen, "'('");
    IdentifierList parameters = identifierList();
    consume(TokenType::RightParen, "')'");

    ptr<Function> function = make<Function>(make<IdentifierList>(parameters), statementBlock());
    descriptor -> putFunction(identifier, scope, function);
}